

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O0

bool __thiscall test_CEObservation::test_cache(test_CEObservation *this)

{
  bool bVar1;
  byte bVar2;
  long *in_RDI;
  double test_y;
  double test_x;
  CESkyCoord test2;
  CESkyCoord obs_coords;
  CEObservation test1;
  double *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  double *in_stack_fffffffffffffa18;
  allocator *paVar3;
  CEObservation *in_stack_fffffffffffffa20;
  CESkyCoord *in_stack_fffffffffffffa28;
  CEDate *in_stack_fffffffffffffa30;
  CEAngle *in_stack_fffffffffffffa38;
  CESkyCoord *in_stack_fffffffffffffa40;
  double *in_stack_fffffffffffffa48;
  CESkyCoord *in_stack_fffffffffffffa68;
  CESkyCoord *in_stack_fffffffffffffa70;
  CEObservation *in_stack_fffffffffffffa80;
  undefined4 local_4e8;
  allocator local_4e1;
  string local_4e0 [32];
  undefined8 local_4c0;
  undefined4 local_4b8;
  allocator local_4b1;
  string local_4b0 [32];
  undefined8 local_490;
  undefined4 local_488;
  allocator local_481;
  string local_480 [96];
  CEAngle local_420;
  double local_410;
  undefined4 local_408;
  allocator local_401;
  string local_400 [96];
  CEAngle local_3a0;
  double local_390 [3];
  undefined4 local_378;
  allocator local_371;
  string local_370 [32];
  undefined8 local_350;
  double local_348;
  undefined4 local_340;
  allocator local_339;
  string local_338 [32];
  undefined8 local_318;
  double local_310;
  undefined4 local_308;
  allocator local_301;
  string local_300 [32];
  undefined8 local_2e0;
  double local_2d8;
  undefined4 local_2d0;
  allocator local_2c9;
  string local_2c8 [36];
  undefined4 local_2a4;
  double local_2a0;
  double local_288;
  undefined4 local_23c;
  undefined8 local_238;
  undefined8 local_220;
  undefined4 local_1d8;
  allocator local_1d1;
  string local_1d0 [32];
  undefined8 local_1b0;
  double local_1a8;
  undefined4 local_1a0;
  allocator local_199;
  string local_198 [32];
  undefined8 local_178;
  double local_170;
  undefined4 local_168;
  allocator local_161;
  string local_160 [32];
  undefined8 local_140;
  double local_138;
  undefined4 local_130;
  allocator local_129;
  string local_128 [32];
  undefined8 local_108;
  double local_100;
  undefined4 local_f8;
  allocator local_f1;
  string local_f0 [32];
  undefined8 local_d0;
  double local_c8;
  undefined4 local_c0;
  allocator local_b9;
  string local_b8 [32];
  undefined8 local_98 [3];
  double local_80 [16];
  
  CEObservation::CEObservation(in_stack_fffffffffffffa20);
  local_80[0] = CEObservation::GetAltitude_Deg((CEObservation *)0x11ee71);
  local_98[0] = 0x4056800000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"test_cache",&local_b9);
  local_c0 = 0x9f;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_80,local_98,local_b8,&local_c0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_c8 = CEObservation::GetAzimuth_Deg(in_stack_fffffffffffffa80);
  local_d0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"test_cache",&local_f1);
  local_f8 = 0xa0;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_c8,&local_d0,local_f0,&local_f8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_100 = CEObservation::GetZenith_Deg(in_stack_fffffffffffffa80);
  local_108 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"test_cache",&local_129);
  local_130 = 0xa1;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_100,&local_108,local_128,&local_130);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_138 = CEObservation::GetApparentXCoordinate_Deg((CEObservation *)0x11f0ba);
  local_140 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"test_cache",&local_161);
  local_168 = 0xa2;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_138,&local_140,local_160,&local_168);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_170 = CEObservation::GetApparentYCoordinate_Deg((CEObservation *)0x11f17b);
  local_178 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"test_cache",&local_199);
  local_1a0 = 0xa3;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_170,&local_178,local_198,&local_1a0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_1a8 = CEObservation::GetHourAngle_Deg((CEObservation *)0x11f23c);
  local_1b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"test_cache",&local_1d1);
  local_1d8 = 0xa4;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1a8,&local_1b0,local_1d0,&local_1d8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  local_220 = 0x4041c69b0fb3c61c;
  CEAngle::Deg(in_stack_fffffffffffffa48);
  local_238 = 0x4063122e3143ccb4;
  CEAngle::Deg(in_stack_fffffffffffffa48);
  local_23c = 3;
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (CEAngle *)in_stack_fffffffffffffa30,(CESkyCoordType *)in_stack_fffffffffffffa28);
  CEAngle::~CEAngle((CEAngle *)0x11f381);
  CEAngle::~CEAngle((CEAngle *)0x11f38e);
  local_288 = CEObservation::GetAzimuth_Rad(in_stack_fffffffffffffa80);
  CEAngle::CEAngle((CEAngle *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_2a0 = CEObservation::GetZenith_Rad(in_stack_fffffffffffffa80);
  CEAngle::CEAngle((CEAngle *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_2a4 = 3;
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (CEAngle *)in_stack_fffffffffffffa30,(CESkyCoordType *)in_stack_fffffffffffffa28);
  CEAngle::~CEAngle((CEAngle *)0x11f45d);
  CEAngle::~CEAngle((CEAngle *)0x11f46a);
  bVar1 = operator==(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"test_cache",&local_2c9);
  local_2d0 = 0xb0;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar1,local_2c8,&local_2d0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  local_2d8 = CEObservation::GetApparentXCoordinate_Deg((CEObservation *)0x11f524);
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"test_cache",&local_301);
  local_308 = 0xb1;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_2d8,&local_2e0,local_300,&local_308);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  local_310 = CEObservation::GetApparentYCoordinate_Deg((CEObservation *)0x11f5e0);
  local_318 = 0;
  paVar3 = &local_339;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"test_cache",paVar3);
  local_340 = 0xb2;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_310,&local_318,local_338,&local_340);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  local_348 = CEObservation::GetHourAngle_Deg((CEObservation *)0x11f69c);
  local_350 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"test_cache",&local_371);
  local_378 = 0xb3;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_348,&local_350,local_370,&local_378);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  local_390[2] = 0.0;
  local_390[1] = 0.0;
  CEObservation::GetAzimuthZenith_Deg
            ((CEObservation *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
             in_stack_fffffffffffffa08,(double *)0x11f780);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffa30,(double)in_stack_fffffffffffffa28,
                 (CEDateType)((ulong)in_stack_fffffffffffffa20 >> 0x20));
  CESkyCoord::XCoord(in_stack_fffffffffffffa28,(CEDate *)in_stack_fffffffffffffa20);
  local_390[0] = CEAngle::Deg(&local_3a0);
  paVar3 = &local_401;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"test_cache",paVar3);
  local_408 = 0xba;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_390 + 2,local_390,local_400,&local_408);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  CEAngle::~CEAngle((CEAngle *)0x11f87b);
  CEDate::~CEDate((CEDate *)0x11f888);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffa30,(double)in_stack_fffffffffffffa28,
                 (CEDateType)((ulong)in_stack_fffffffffffffa20 >> 0x20));
  CESkyCoord::YCoord(in_stack_fffffffffffffa28,(CEDate *)in_stack_fffffffffffffa20);
  local_410 = CEAngle::Deg(&local_420);
  paVar3 = &local_481;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"test_cache",paVar3);
  local_488 = 0xbb;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_390 + 1,&local_410,local_480,&local_488);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  CEAngle::~CEAngle((CEAngle *)0x11f981);
  CEDate::~CEDate((CEDate *)0x11f98e);
  CEObservation::GetApparentXYCoordinate_Deg
            ((CEObservation *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
             in_stack_fffffffffffffa08,(double *)0x11f9b2);
  local_490 = 0;
  paVar3 = &local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"test_cache",paVar3);
  local_4b8 = 0xbf;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_390 + 2,&local_490,local_4b0,&local_4b8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  local_4c0 = 0;
  paVar3 = &local_4e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"test_cache",paVar3);
  local_4e8 = 0xc0;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_390 + 1,&local_4c0,local_4e0,&local_4e8);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  bVar2 = (**(code **)(*in_RDI + 0x18))();
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar2,in_stack_fffffffffffffa10));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar2,in_stack_fffffffffffffa10));
  CEObservation::~CEObservation((CEObservation *)CONCAT17(bVar2,in_stack_fffffffffffffa10));
  return (bool)(bVar2 & 1);
}

Assistant:

bool test_CEObservation::test_cache(void)
{
    // Test default values
    CEObservation test1;
    test_double(test1.GetAltitude_Deg(), 90.0, __func__, __LINE__);
    test_double(test1.GetAzimuth_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetZenith_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetApparentXCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetApparentYCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetHourAngle_Deg(), 0.0, __func__, __LINE__);
    
    // Now we setup the actual tests for observed coordinates
    // Note: these coordinates are derived from CESkyCoord tests
    CESkyCoord obs_coords(CEAngle::Deg(35.55160709646245), 
                          CEAngle::Deg(152.5681387256824),
                          CESkyCoordType::OBSERVED);
    CESkyCoord test2(base_obs_.GetAzimuth_Rad(),
                     base_obs_.GetZenith_Rad(),
                     CESkyCoordType::OBSERVED);

    // Test that the coordinates update when the date is changed
    test(obs_coords == test2, __func__, __LINE__);
    test_double(base_obs_.GetApparentXCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(base_obs_.GetApparentYCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(base_obs_.GetHourAngle_Deg(), 0.0, __func__, __LINE__);

    // Test the actual coordinates
    double test_x(0), test_y(0);
        
    // Test observed coordinates
    base_obs_.GetAzimuthZenith_Deg(&test_x, &test_y);
    test_double(test_x, test2.XCoord().Deg(), __func__, __LINE__);
    test_double(test_y, test2.YCoord().Deg(), __func__, __LINE__);

    // Test apparent coordinates
    base_obs_.GetApparentXYCoordinate_Deg(&test_x, &test_y);
    test_double(test_x, 0.0, __func__, __LINE__);
    test_double(test_y, 0.0, __func__, __LINE__);

    return pass();
}